

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O0

Elf64_Phdr * __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::GetPhdr(ElfMemImage *this,int index)

{
  bool bVar1;
  Elf64_Phdr *pEVar2;
  char *absl_raw_log_internal_basename;
  int index_local;
  ElfMemImage *this_local;
  
  bVar1 = false;
  if (-1 < index) {
    bVar1 = index < (int)(uint)this->ehdr_->e_phnum;
  }
  if (bVar1) {
    pEVar2 = anon_unknown_1::GetTableElement<Elf64_Phdr>
                       (this->ehdr_,this->ehdr_->e_phoff,(uint)this->ehdr_->e_phentsize,(long)index)
    ;
    return pEVar2;
  }
  raw_log_internal::RawLog
            (kFatal,"elf_mem_image.cc",0x69,"Check %s failed: %s",
             "index >= 0 && index < ehdr_->e_phnum","index out of range");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                ,0x69,"const Elf64_Phdr *absl::debugging_internal::ElfMemImage::GetPhdr(int) const")
  ;
}

Assistant:

const ElfW(Phdr) *ElfMemImage::GetPhdr(int index) const {
  ABSL_RAW_CHECK(index >= 0 && index < ehdr_->e_phnum, "index out of range");
  return GetTableElement<ElfW(Phdr)>(ehdr_, ehdr_->e_phoff, ehdr_->e_phentsize,
                                     static_cast<size_t>(index));
}